

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

double gmlc::utilities::numeric_conversion<double>(string_view V,double defValue)

{
  string_view V_00;
  bool bVar1;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  invalid_argument *anon_var_0;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  double local_8;
  
  local_8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  V_00._M_str = in_stack_ffffffffffffffa0;
  V_00._M_len = in_stack_ffffffffffffff98;
  bVar1 = nonNumericFirstCharacter(V_00);
  if (!bVar1) {
    local_8 = numConv<double>(in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}